

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O2

int sprint_timestamp(char *ts_buffer,char timestamp,timeval *tv,timeval *last_tv)

{
  int iVar1;
  tm *ptVar2;
  long lVar3;
  __suseconds_t _Var4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  undefined7 in_register_00000031;
  char *__format;
  char timestring [25];
  tm tm;
  
  pcVar7 = timestring;
  iVar1 = (int)CONCAT71(in_register_00000031,timestamp);
  if (iVar1 == 0x41) {
    ptVar2 = localtime(&tv->tv_sec);
    tm.tm_sec = ptVar2->tm_sec;
    tm.tm_min = ptVar2->tm_min;
    tm.tm_hour = ptVar2->tm_hour;
    tm.tm_mday = ptVar2->tm_mday;
    tm.tm_mon = ptVar2->tm_mon;
    tm.tm_year = ptVar2->tm_year;
    tm.tm_wday = ptVar2->tm_wday;
    tm.tm_yday = ptVar2->tm_yday;
    tm.tm_isdst = ptVar2->tm_isdst;
    tm._36_4_ = *(undefined4 *)&ptVar2->field_0x24;
    tm.tm_gmtoff = ptVar2->tm_gmtoff;
    tm.tm_zone = ptVar2->tm_zone;
    strftime(timestring,0x18,"%Y-%m-%d %H:%M:%S",(tm *)&tm);
    _Var4 = tv->tv_usec;
    __format = "(%s.%06llu) ";
LAB_00103cb9:
    iVar1 = sprintf(ts_buffer,__format,pcVar7,_Var4);
  }
  else {
    if ((iVar1 != 0x7a) && (iVar1 != 100)) {
      if (iVar1 != 0x61) goto LAB_00103cc4;
      pcVar7 = (char *)tv->tv_sec;
      _Var4 = tv->tv_usec;
      __format = "(%010llu.%06llu) ";
      goto LAB_00103cb9;
    }
    lVar6 = last_tv->tv_sec;
    if (lVar6 == 0) {
      _Var4 = tv->tv_usec;
      last_tv->tv_sec = tv->tv_sec;
      last_tv->tv_usec = _Var4;
      lVar6 = last_tv->tv_sec;
    }
    lVar5 = tv->tv_usec - last_tv->tv_usec;
    lVar3 = lVar5 + 1000000;
    if (-1 < lVar5) {
      lVar3 = lVar5;
    }
    lVar6 = (lVar5 >> 0x3f) + (tv->tv_sec - lVar6);
    if (lVar6 < 0) {
      lVar3 = 0;
    }
    if (lVar6 < 1) {
      lVar6 = 0;
    }
    iVar1 = sprintf(ts_buffer,"(%03llu.%06llu) ",lVar6,lVar3);
    if (timestamp == 'd') {
      _Var4 = tv->tv_usec;
      last_tv->tv_sec = tv->tv_sec;
      last_tv->tv_usec = _Var4;
    }
  }
  if (0 < iVar1) {
    return iVar1;
  }
LAB_00103cc4:
  *ts_buffer = '\0';
  return 0;
}

Assistant:

static int sprint_timestamp(char *ts_buffer, const char timestamp,
			    const struct timeval *tv, struct timeval *const last_tv)
{
	int numchars = 0;

	switch (timestamp) {
	case 'a': /* absolute with timestamp */
		numchars = sprintf(ts_buffer, "(%010llu.%06llu) ",
				   (unsigned long long)tv->tv_sec,
				   (unsigned long long)tv->tv_usec);
		break;

	case 'A': /* absolute with date */
	{
		struct tm tm;
		char timestring[25];

		tm = *localtime(&tv->tv_sec);
		strftime(timestring, 24, "%Y-%m-%d %H:%M:%S", &tm);
		numchars = sprintf(ts_buffer, "(%s.%06llu) ", timestring,
				   (unsigned long long)tv->tv_usec);
	}
	break;

	case 'd': /* delta */
	case 'z': /* starting with zero */
	{
		struct timeval diff;

		if (last_tv->tv_sec == 0) /* first init */
			*last_tv = *tv;
		diff.tv_sec = tv->tv_sec - last_tv->tv_sec;
		diff.tv_usec = tv->tv_usec - last_tv->tv_usec;
		if (diff.tv_usec < 0)
			diff.tv_sec--, diff.tv_usec += 1000000;
		if (diff.tv_sec < 0)
			diff.tv_sec = diff.tv_usec = 0;
		numchars = sprintf(ts_buffer, "(%03llu.%06llu) ",
				   (unsigned long long)diff.tv_sec,
				   (unsigned long long)diff.tv_usec);

		if (timestamp == 'd')
			*last_tv = *tv; /* update for delta calculation */
	}
	break;

	default: /* no timestamp output */
		break;
	}

	if (numchars <= 0) {
		ts_buffer[0] = 0; /* empty terminated string */
		numchars = 0;
	}

	return numchars;
}